

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-xml-parser.c
# Opt level: O0

void start_element_handler(void *data,char *el,char **attr)

{
  undefined8 uVar1;
  hashtable *table;
  char **ppcVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  coda_mem_array *pcVar6;
  coda_type_array *type;
  char **ppcVar7;
  coda_type_record *pcVar8;
  coda_mem_record *pcVar9;
  coda_type *array_definition_1;
  int i;
  coda_type_array *array_definition;
  coda_mem_array *array;
  coda_dynamic_type *pcStack_38;
  int index;
  coda_mem_record *parent;
  coda_type *definition;
  parser_info_conflict *info;
  char **attr_local;
  char *el_local;
  void *data_local;
  
  definition = (coda_type *)data;
  info = (parser_info_conflict *)attr;
  attr_local = (char **)el;
  el_local = (char *)data;
  if (*(long *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120) == 0) {
    coda_set_error(-300,"mixed content for element \'%s\' is not supported",
                   *(undefined8 *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 800));
    abort_parser((parser_info_conflict *)definition);
  }
  else if (**(int **)(*(long *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120) + 8) ==
           2) {
    *(undefined8 *)((long)data + 0x430) = 0;
    if (*(int *)((long)data + 0x18) < 0x1f) {
      *(int *)((long)data + 0x18) = *(int *)((long)data + 0x18) + 1;
      *(undefined8 *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120) = 0;
      pcStack_38 = *(coda_dynamic_type **)
                    ((long)data + (long)(*(int *)((long)data + 0x18) + -1) * 8 + 0x120);
      lVar5 = coda_hashtable_get_index_from_name
                        (*(hashtable **)&pcStack_38->definition[1].type_class,el);
      array._4_4_ = (int)lVar5;
      if (array._4_4_ < 0) {
        table = *(hashtable **)&pcStack_38->definition[1].type_class;
        pcVar4 = coda_element_name_from_xml_name((char *)attr_local);
        lVar5 = coda_hashtable_get_index_from_name(table,pcVar4);
        array._4_4_ = (int)lVar5;
      }
      if (array._4_4_ < 0) {
        if (definition[0x13].format == coda_format_ascii) {
          if (*(int *)&definition->description == 1) {
            coda_set_error(-300,"xml element \'%s\' is not allowed as root element",attr_local);
          }
          else {
            coda_set_error(-300,"xml element \'%s\' is not allowed within element \'%s\'",attr_local
                           ,(&definition[0xe].name)[*(int *)&definition->description + -1]);
          }
          abort_parser((parser_info_conflict *)definition);
          return;
        }
        parent = (coda_mem_record *)coda_type_record_new(coda_format_xml);
        if ((coda_type_record *)parent == (coda_type_record *)0x0) {
          abort_parser((parser_info_conflict *)definition);
          return;
        }
        iVar3 = coda_type_record_create_field
                          ((coda_type_record *)pcStack_38->definition,(char *)attr_local,
                           (coda_type *)parent);
        if (iVar3 != 0) {
          coda_type_release((coda_type *)parent);
          abort_parser((parser_info_conflict *)definition);
          return;
        }
        coda_type_release((coda_type *)parent);
        iVar3 = coda_mem_type_update(&stack0xffffffffffffffc8,pcStack_38->definition);
        if (iVar3 != 0) {
          abort_parser((parser_info_conflict *)definition);
          return;
        }
        if (pcStack_38 !=
            *(coda_dynamic_type **)
             (&definition[5].type_class + (long)(*(int *)&definition->description + -1) * 2)) {
          __assert_fail("parent == info->record[info->depth - 1]",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                        ,0x18b,"void start_element_handler(void *, const char *, const char **)");
        }
        lVar5 = coda_hashtable_get_index_from_name
                          (*(hashtable **)&pcStack_38->definition[1].type_class,(char *)attr_local);
        array._4_4_ = (int)lVar5;
        if (array._4_4_ < 0) {
          __assert_fail("index >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                        ,0x18d,"void start_element_handler(void *, const char *, const char **)");
        }
      }
      (&definition[9].size_expr)[*(int *)&definition->description] =
           (coda_expression *)(long)array._4_4_;
      (&definition->bit_size)[*(int *)&definition->description] =
           *(long *)(pcStack_38->definition[1].description + (long)array._4_4_ * 8) + 0x10;
      iVar3 = coda_type_get_record_field_real_name
                        (pcStack_38->definition,(long)array._4_4_,
                         &definition[0xe].name + *(int *)&definition->description);
      if (iVar3 == 0) {
        parent = *(coda_mem_record **)(&definition->bit_size)[*(int *)&definition->description];
        if (((coda_type_array *)parent)->type_class == coda_array_class) {
          if (((coda_type_array *)parent)->format == coda_format_xml) {
            if (*(long *)(&(pcStack_38[2].definition)->format + (long)array._4_4_ * 2) == 0) {
              pcVar6 = coda_mem_array_new((coda_type_array *)parent,(coda_dynamic_type *)0x0);
              *(coda_mem_array **)(&(pcStack_38[2].definition)->format + (long)array._4_4_ * 2) =
                   pcVar6;
              if (*(long *)(&(pcStack_38[2].definition)->format + (long)array._4_4_ * 2) == 0) {
                abort_parser((parser_info_conflict *)definition);
                return;
              }
            }
            (&definition->bit_size)[*(int *)&definition->description] =
                 (int64_t)&parent[1].definition;
            parent = *(coda_mem_record **)(&definition->bit_size)[*(int *)&definition->description];
          }
        }
        else if (*(long *)(&(pcStack_38[2].definition)->format + (long)array._4_4_ * 2) != 0) {
          if (definition[0x13].format == coda_format_ascii) {
            coda_set_error(-300,
                           "xml element \'%s\' is not allowed more than once within element \'%s\'",
                           attr_local,(&definition[0xe].name)[*(int *)&definition->description + -1]
                          );
            abort_parser((parser_info_conflict *)definition);
            return;
          }
          type = coda_type_array_new(coda_format_xml);
          if (type == (coda_type_array *)0x0) {
            abort_parser((parser_info_conflict *)definition);
            return;
          }
          iVar3 = coda_type_array_set_base_type(type,(coda_type *)parent);
          if (iVar3 != 0) {
            coda_type_release((coda_type *)type);
            abort_parser((parser_info_conflict *)definition);
            return;
          }
          *(coda_type_array **)(&definition->bit_size)[*(int *)&definition->description] = type;
          coda_type_release((coda_type *)parent);
          iVar3 = coda_type_array_add_variable_dimension(type,(coda_expression *)0x0);
          if (iVar3 != 0) {
            abort_parser((parser_info_conflict *)definition);
            return;
          }
          pcVar6 = coda_mem_array_new(type,(coda_dynamic_type *)0x0);
          if (pcVar6 == (coda_mem_array *)0x0) {
            abort_parser((parser_info_conflict *)definition);
            return;
          }
          iVar3 = coda_mem_array_add_element
                            (pcVar6,*(coda_dynamic_type **)
                                     (&(pcStack_38[2].definition)->format + (long)array._4_4_ * 2));
          if (iVar3 != 0) {
            abort_parser((parser_info_conflict *)definition);
            return;
          }
          *(coda_mem_array **)(&(pcStack_38[2].definition)->format + (long)array._4_4_ * 2) = pcVar6
          ;
          (&definition->bit_size)[*(int *)&definition->description] = (int64_t)&type->base_type;
          parent = *(coda_mem_record **)(&definition->bit_size)[*(int *)&definition->description];
        }
        ppcVar2 = attr_local;
        if (*(long *)(parent + 1) == 0) {
          definition[0x12].attributes = (coda_type_record *)0x0;
          if (definition[0x13].format == coda_format_ascii) {
            if (info->parser != (XML_Parser)0x0) {
              coda_set_error(-300,"xml attribute \'%s\' is not allowed",info->parser);
              abort_parser((parser_info_conflict *)definition);
              return;
            }
          }
          else if ((info->parser != (XML_Parser)0x0) ||
                  (ppcVar7 = (char **)coda_element_name_from_xml_name((char *)attr_local),
                  ppcVar2 != ppcVar7)) {
            pcVar8 = coda_type_record_new(coda_format_xml);
            *(coda_type_record **)(parent + 1) = pcVar8;
            if (*(long *)(parent + 1) == 0) {
              abort_parser((parser_info_conflict *)definition);
              return;
            }
            pcVar8 = (coda_type_record *)
                     attribute_record_new
                               (*(coda_type_record **)(parent + 1),
                                (coda_xml_product *)definition->name,(char *)attr_local,
                                (char **)info,definition[0x13].format);
            definition[0x12].attributes = pcVar8;
            if (definition[0x12].attributes == (coda_type_record *)0x0) {
              abort_parser((parser_info_conflict *)definition);
              return;
            }
          }
        }
        else {
          pcVar8 = (coda_type_record *)
                   attribute_record_new
                             (*(coda_type_record **)(parent + 1),
                              (coda_xml_product *)definition->name,(char *)attr_local,(char **)info,
                              definition[0x13].format);
          definition[0x12].attributes = pcVar8;
          if (definition[0x12].attributes == (coda_type_record *)0x0) {
            abort_parser((parser_info_conflict *)definition);
            return;
          }
        }
        if ((parent->backend == 2) && (*(int *)&parent->definition == 0)) {
          if (parent[2].backend != coda_backend_ascii) {
            __assert_fail("!((coda_type_record *)definition)->is_union",
                          "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                          ,0x223,"void start_element_handler(void *, const char *, const char **)");
          }
          pcVar9 = coda_mem_record_new((coda_type_record *)parent,
                                       (coda_dynamic_type *)definition[0x12].attributes);
          *(coda_mem_record **)
           (&definition[5].type_class + (long)*(int *)&definition->description * 2) = pcVar9;
          if (*(long *)(&definition[5].type_class + (long)*(int *)&definition->description * 2) == 0
             ) {
            abort_parser((parser_info_conflict *)definition);
          }
          else {
            for (array_definition_1._4_4_ = 0;
                (long)array_definition_1._4_4_ <
                *(long *)(*(long *)(&definition[5].type_class +
                                   (long)*(int *)&definition->description * 2) + 0x20);
                array_definition_1._4_4_ = array_definition_1._4_4_ + 1) {
              if ((*(int *)(*(long *)(*(long *)(parent[1].num_fields +
                                               (long)array_definition_1._4_4_ * 8) + 0x10) + 8) == 1
                  ) && (**(int **)(*(long *)(parent[1].num_fields +
                                            (long)array_definition_1._4_4_ * 8) + 0x10) == 2)) {
                pcVar6 = coda_mem_array_new(*(coda_type_array **)
                                             (*(long *)(parent[1].num_fields +
                                                       (long)array_definition_1._4_4_ * 8) + 0x10),
                                            (coda_dynamic_type *)0x0);
                *(coda_mem_array **)
                 (*(long *)(*(long *)(&definition[5].type_class +
                                     (long)*(int *)&definition->description * 2) + 0x28) +
                 (long)array_definition_1._4_4_ * 8) = pcVar6;
                if (*(long *)(*(long *)(*(long *)(&definition[5].type_class +
                                                 (long)*(int *)&definition->description * 2) + 0x28)
                             + (long)array_definition_1._4_4_ * 8) == 0) {
                  abort_parser((parser_info_conflict *)definition);
                  return;
                }
              }
            }
            definition[0x12].attributes = (coda_type_record *)0x0;
          }
        }
      }
      else {
        abort_parser((parser_info_conflict *)definition);
      }
    }
    else {
      coda_set_error(-300,"xml file exceeds maximum supported hierarchical depth (%d)",0x20);
      abort_parser((parser_info_conflict *)definition);
    }
  }
  else {
    uVar1 = *(undefined8 *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 800);
    pcVar4 = coda_type_get_format_name
                       (**(coda_format **)
                          (*(long *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120) + 8
                          ));
    coda_set_error(-300,"xml element \'%s\' not allowed inside %s data",uVar1,pcVar4);
    abort_parser((parser_info_conflict *)definition);
  }
  return;
}

Assistant:

static void XMLCALL start_element_handler(void *data, const char *el, const char **attr)
{
    parser_info *info;
    coda_type *definition;
    coda_mem_record *parent;
    int index;

    info = (parser_info *)data;

    if (info->record[info->depth] != NULL)
    {
        if (info->record[info->depth]->definition->format != coda_format_xml)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "xml element '%s' not allowed inside %s data",
                           info->xml_name[info->depth],
                           coda_type_get_format_name(info->record[info->depth]->definition->format));
            abort_parser(info);
            return;
        }
    }
    else
    {
        coda_set_error(CODA_ERROR_PRODUCT, "mixed content for element '%s' is not supported",
                       info->xml_name[info->depth]);
        abort_parser(info);
        return;
    }

    info->value_length = 0;

    if (info->depth >= CODA_CURSOR_MAXDEPTH - 1)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "xml file exceeds maximum supported hierarchical depth (%d)",
                       CODA_CURSOR_MAXDEPTH);
        abort_parser(info);
        return;
    }
    info->depth++;

    info->record[info->depth] = NULL;
    parent = info->record[info->depth - 1];
    index = hashtable_get_index_from_name(parent->definition->real_name_hash_data, el);
    if (index < 0)
    {
        index = hashtable_get_index_from_name(parent->definition->real_name_hash_data,
                                              coda_element_name_from_xml_name(el));
    }
    if (index < 0)
    {
        if (info->update_definition)
        {
            /* all xml elements start out as empty records */
            definition = (coda_type *)coda_type_record_new(coda_format_xml);
            if (definition == NULL)
            {
                abort_parser(info);
                return;
            }
            if (coda_type_record_create_field(parent->definition, el, definition) != 0)
            {
                coda_type_release(definition);
                abort_parser(info);
                return;
            }
            coda_type_release(definition);

            if (coda_mem_type_update((coda_dynamic_type **)&parent, (coda_type *)parent->definition) != 0)
            {
                abort_parser(info);
                return;
            }
            /* updating the parent should only have changed the fields, and not the main record */
            assert(parent == info->record[info->depth - 1]);
            index = hashtable_get_index_from_name(parent->definition->real_name_hash_data, el);
            assert(index >= 0);
        }
        else
        {
            if (info->depth == 1)
            {
                coda_set_error(CODA_ERROR_PRODUCT, "xml element '%s' is not allowed as root element", el);
            }
            else
            {
                coda_set_error(CODA_ERROR_PRODUCT, "xml element '%s' is not allowed within element '%s'", el,
                               info->xml_name[info->depth - 1]);
            }
            abort_parser(info);
            return;
        }
    }
    info->index[info->depth] = index;
    info->definition[info->depth] = &parent->definition->field[index]->type;
    if (coda_type_get_record_field_real_name((coda_type *)parent->definition, index, &info->xml_name[info->depth]) != 0)
    {
        abort_parser(info);
        return;
    }
    definition = *info->definition[info->depth];

    if (definition->type_class == coda_array_class)
    {
        /* use the base type when the definition points to an array of xml elements */
        if (definition->format == coda_format_xml)
        {
            if (parent->field_type[index] == NULL)
            {
                parent->field_type[index] = (coda_dynamic_type *)coda_mem_array_new((coda_type_array *)definition,
                                                                                    NULL);
                if (parent->field_type[index] == NULL)
                {
                    abort_parser(info);
                    return;
                }
            }
            /* take the array element definition */
            info->definition[info->depth] = &((coda_type_array *)definition)->base_type;
            definition = *info->definition[info->depth];
        }
    }
    else if (parent->field_type[index] != NULL)
    {
        if (info->update_definition)
        {
            coda_mem_array *array;
            coda_type_array *array_definition;

            /* change scalar to array in definition */
            array_definition = coda_type_array_new(coda_format_xml);
            if (array_definition == NULL)
            {
                abort_parser(info);
                return;
            }
            if (coda_type_array_set_base_type(array_definition, definition) != 0)
            {
                coda_type_release((coda_type *)array_definition);
                abort_parser(info);
                return;
            }
            *info->definition[info->depth] = (coda_type *)array_definition;
            coda_type_release(definition);
            if (coda_type_array_add_variable_dimension(array_definition, NULL) != 0)
            {
                abort_parser(info);
                return;
            }

            /* create the array and add the existing element */
            array = coda_mem_array_new(array_definition, NULL);
            if (array == NULL)
            {
                abort_parser(info);
                return;
            }
            if (coda_mem_array_add_element(array, parent->field_type[index]) != 0)
            {
                abort_parser(info);
                return;
            }
            parent->field_type[index] = (coda_dynamic_type *)array;

            /* take the array element definition */
            info->definition[info->depth] = &array_definition->base_type;
            definition = *info->definition[info->depth];
        }
        else
        {
            coda_set_error(CODA_ERROR_PRODUCT, "xml element '%s' is not allowed more than once within element '%s'",
                           el, info->xml_name[info->depth - 1]);
            abort_parser(info);
            return;
        }
    }

    /* create attributes record */
    if (definition->attributes == NULL)
    {
        info->attributes = NULL;
        if (info->update_definition)
        {
            if (attr[0] != NULL || el != coda_element_name_from_xml_name(el))
            {
                definition->attributes = coda_type_record_new(coda_format_xml);
                if (definition->attributes == NULL)
                {
                    abort_parser(info);
                    return;
                }
                info->attributes = (coda_dynamic_type *)attribute_record_new(definition->attributes, info->product,
                                                                             el, attr, info->update_definition);
                if (info->attributes == NULL)
                {
                    abort_parser(info);
                    return;
                }
            }
        }
        else
        {
            if (attr[0] != NULL)
            {
                coda_set_error(CODA_ERROR_PRODUCT, "xml attribute '%s' is not allowed", attr[0]);
                abort_parser(info);
                return;
            }
        }
    }
    else
    {
        info->attributes = (coda_dynamic_type *)attribute_record_new(definition->attributes, info->product, el, attr,
                                                                     info->update_definition);
        if (info->attributes == NULL)
        {
            abort_parser(info);
            return;
        }
    }

    /* xml records are already created here in order to allow adding child xml elements */
    if (definition->format == coda_format_xml && definition->type_class == coda_record_class)
    {
        int i;

        assert(!((coda_type_record *)definition)->is_union);
        info->record[info->depth] = coda_mem_record_new((coda_type_record *)definition, info->attributes);
        if (info->record[info->depth] == NULL)
        {
            abort_parser(info);
            return;
        }
        /* create empty arrays for array child elements */
        for (i = 0; i < info->record[info->depth]->num_fields; i++)
        {
            if (((coda_type_record *)definition)->field[i]->type->type_class == coda_array_class &&
                ((coda_type_record *)definition)->field[i]->type->format == coda_format_xml)
            {
                coda_type *array_definition = ((coda_type_record *)definition)->field[i]->type;

                info->record[info->depth]->field_type[i] =
                    (coda_dynamic_type *)coda_mem_array_new((coda_type_array *)array_definition, NULL);
                if (info->record[info->depth]->field_type[i] == NULL)
                {
                    abort_parser(info);
                    return;
                }
            }
        }
        info->attributes = NULL;
    }
}